

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser-count.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  iterator iVar1;
  undefined8 extraout_RAX;
  long *plVar2;
  char *pcVar3;
  ostream *poVar4;
  int extraout_EDX;
  positional_arguments_t positional_arguments;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cell_count;
  filtered_directed_graph_t graph;
  named_arguments_t named_arguments;
  flagser_parameters params;
  cli_arguments_t arguments;
  vector<const_char_*,_std::allocator<const_char_*>_> local_290;
  string local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  pointer local_220;
  pointer local_210;
  pointer local_208;
  pointer local_1f8;
  pointer local_1f0;
  pointer local_1e0;
  pointer local_1d0;
  pointer local_1c0;
  pointer local_1b8;
  pointer local_1a8;
  pointer local_198;
  pointer local_188;
  pointer local_180;
  pointer local_170;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_168;
  flagser_parameters local_130;
  cli_arguments_t local_68;
  
  parse_arguments_abi_cxx11_(&local_68,argc,argv);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_290,&local_68.first);
  local_240._0_8_ = &local_168;
  local_168._M_buckets = (__buckets_ptr)0x0;
  local_168._M_bucket_count = local_68.second._M_h._M_bucket_count;
  local_168._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_168._M_element_count = local_68.second._M_h._M_element_count;
  local_168._M_rehash_policy._M_max_load_factor =
       local_68.second._M_h._M_rehash_policy._M_max_load_factor;
  local_168._M_rehash_policy._4_4_ = local_68.second._M_h._M_rehash_policy._4_4_;
  local_168._M_rehash_policy._M_next_resize = local_68.second._M_h._M_rehash_policy._M_next_resize;
  local_168._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,char_const*>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_240._0_8_,&local_68.second._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>_>_>
              *)local_240);
  flagser_parameters::flagser_parameters(&local_130,(named_arguments_t *)&local_168);
  local_240._0_8_ = (__hashtable_alloc *)(local_240 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"help","");
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_168,(key_type *)local_240);
  if ((__hashtable_alloc *)local_240._0_8_ != (__hashtable_alloc *)(local_240 + 0x10)) {
    operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
  }
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
       ._M_cur == (__node_type *)0x0) &&
     (local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string
              ((string *)&local_278,
               *local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start,(allocator *)&local_258);
    read_filtered_directed_graph((filtered_directed_graph_t *)local_240,&local_278,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    count_cells(&local_258,(filtered_directed_graph_t *)local_240,&local_130);
    if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_180 != (pointer)0x0) {
      operator_delete(local_180,(long)local_170 - (long)local_180);
    }
    if (local_198 != (pointer)0x0) {
      operator_delete(local_198,(long)local_188 - (long)local_198);
    }
    if (local_1b8 != (pointer)0x0) {
      operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
    }
    if (local_1d0 != (pointer)0x0) {
      operator_delete(local_1d0,(long)local_1c0 - (long)local_1d0);
    }
    if (local_1f0 != (pointer)0x0) {
      operator_delete(local_1f0,(long)local_1e0 - (long)local_1f0);
    }
    if (local_208 != (pointer)0x0) {
      operator_delete(local_208,(long)local_1f8 - (long)local_208);
    }
    if (local_220 != (pointer)0x0) {
      operator_delete(local_220,(long)local_210 - (long)local_220);
    }
    if ((pointer)local_240._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_240._8_8_,local_230._8_8_ - local_240._8_8_);
    }
    if (local_130.filtration_algorithm._M_t.
        super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>.
        _M_t.
        super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
        .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>)0x0)
    {
      (*(*(_func_int ***)
          local_130.filtration_algorithm._M_t.
          super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
          .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl)[1])();
    }
    local_130.filtration_algorithm._M_t.
    super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t
    .super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
    super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>,_true,_true>
          )(__uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>)
           0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.hdf5_type._M_dataplus._M_p != &local_130.hdf5_type.field_2) {
      operator_delete(local_130.hdf5_type._M_dataplus._M_p,
                      local_130.hdf5_type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.cache._M_dataplus._M_p != &local_130.cache.field_2) {
      operator_delete(local_130.cache._M_dataplus._M_p,
                      local_130.cache.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.output_format._M_dataplus._M_p != &local_130.output_format.field_2) {
      operator_delete(local_130.output_format._M_dataplus._M_p,
                      local_130.output_format.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.output_name._M_dataplus._M_p != &local_130.output_name.field_2) {
      operator_delete(local_130.output_name._M_dataplus._M_p,
                      local_130.output_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.input_format._M_dataplus._M_p != &local_130.input_format.field_2) {
      operator_delete(local_130.input_format._M_dataplus._M_p,
                      local_130.input_format.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_168);
    if (local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_290.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_290.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68.second._M_h);
    if (local_68.first.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.first.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.first.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.first.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    print_usage_and_exit(-1);
    filtered_directed_graph_t::~filtered_directed_graph_t((filtered_directed_graph_t *)local_240);
    flagser_parameters::~flagser_parameters(&local_130);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_168);
    if (local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_290.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_290.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::~pair(&local_68);
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar2 = (long *)__cxa_begin_catch(extraout_RAX);
    pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar4);
    __cxa_end_catch();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	try {
		auto arguments = parse_arguments(argc, argv);

		auto positional_arguments = get_positional_arguments(arguments);
		auto named_arguments = get_named_arguments(arguments);
		auto params = flagser_parameters(named_arguments);
		named_arguments_t::const_iterator it;
		if (named_arguments.find("help") != named_arguments.end()) { print_usage_and_exit(-1); }

		if (positional_arguments.size() == 0) { print_usage_and_exit(-1); }
		const char* input_filename = positional_arguments[0];

		filtered_directed_graph_t graph = read_filtered_directed_graph(input_filename, params);

		auto cell_count = count_cells(graph, params);
	} catch (const std::exception& e) { std::cout << e.what() << std::endl; }
}